

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hextile.hpp
# Opt level: O2

void __thiscall
hextile::HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_>::__introspect
          (HexTile<gamespace::BoardTile,_4U,_std::array<unsigned_int,_4UL>_> *this,size_t off)

{
  ostream *poVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)off);
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)local_40);
  poVar1 = std::operator<<(poVar1,"HexTile[");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"]");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_40);
  lVar3 = 0;
  for (uVar2 = 0; uVar2 < this->_y * this->_x; uVar2 = uVar2 + 1) {
    gamespace::BoardTile::__introspect
              ((BoardTile *)
               ((long)((((this->_data).
                         super__Vector_base<gamespace::BoardTile,_std::allocator<gamespace::BoardTile>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_marker_layer)._M_elems +
                      0xfffffffffffffffd) + lVar3),off + 2);
    lVar3 = lVar3 + 0x80;
  }
  return;
}

Assistant:

void __introspect(size_t off) {
            std::cout << std::string(off, ' ') << "HexTile[" << _x << "," << _y << "]" << std::endl;
            for(size_t i = 0; i < _x * _y; ++i)
                _data[i].__introspect(off + 2);
        }